

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O3

void la_adsc_vspd_change_format_text(la_adsc_formatter_ctx_t *ctx,char *label,void *data)

{
  uint uVar1;
  undefined8 in_RAX;
  uint uVar2;
  
  uVar1 = *data;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  la_vstring_append_sprintf
            (ctx->vstr,"%*s%s: %c%d ft/min\n",(ulong)(uint)ctx->indent,"",label,
             (ulong)(((int)~uVar1 >> 0x1f) * -2 + 0x3c),CONCAT44((int)((ulong)in_RAX >> 0x20),uVar2)
            );
  return;
}

Assistant:

LA_ADSC_FORMATTER_FUN(la_adsc_vspd_change_format_text) {
	la_adsc_vspd_chg_event_t const *e = data;
	LA_ISPRINTF(ctx->vstr, ctx->indent,
			"%s: %c%d ft/min\n",
			label,
			e->vspd_threshold >= 0 ? '>' : '<',
			abs(e->vspd_threshold)
			);
}